

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O3

void __thiscall
glslang::TIntermediate::optimizeStageIO(TIntermediate *this,TInfoSink *param_1,TIntermediate *unit)

{
  TDestinationStack *pTVar1;
  char *__s;
  _List_node_base *p_Var2;
  _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
  *this_00;
  TIntermNode *pTVar3;
  undefined8 *******pppppppuVar4;
  _List_node_base *p_Var5;
  undefined8 *******pppppppuVar6;
  TIntermNode **ppTVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar11;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_00;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var12;
  anon_class_8_1_65350a3f demoteMatchingInputs;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  TIntermNode **ppTVar16;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var17;
  TIntermSequence unitAllInputs;
  TIntermSequence allOutputs;
  TIntermSequence unitLiveInputs;
  TIOTraverser unitTraverser;
  TIOTraverser unitAllTraverser;
  TIOTraverser allTraverser;
  _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
  *local_348;
  TIntermediate *local_340;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_338;
  TPoolAllocator *local_330;
  TIntermNode **local_328;
  TIntermNode **ppTStack_320;
  undefined8 local_318;
  TPoolAllocator *local_310;
  undefined8 *local_308;
  undefined8 *puStack_300;
  undefined8 local_2f8;
  TPoolAllocator *local_2f0;
  TIntermNode **local_2e8;
  TIntermNode **ppTStack_2e0;
  undefined8 local_2d8;
  TLiveTraverser local_2d0;
  TPoolAllocator **local_200;
  undefined4 local_1f8;
  pool_allocator<char> local_1f0;
  undefined1 local_1e8;
  undefined7 local_1e7;
  undefined4 uStack_1e0;
  TPoolAllocator *local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 ******local_1b8;
  undefined8 ******local_1b0;
  undefined8 local_1a8;
  TIntermediate *local_1a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_198;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_160;
  undefined1 local_128;
  TPoolAllocator **local_120;
  undefined4 local_118;
  TString local_110;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 ******local_d8;
  undefined8 ******local_d0;
  undefined8 local_c8;
  TIntermediate *local_c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_80;
  undefined1 local_48;
  TPoolAllocator **local_40;
  undefined4 local_38;
  
  if (((int)this->language < 5) && ((int)unit->language < 5)) {
    local_340 = this;
    local_2f0 = GetThreadPoolAllocator();
    local_2e8 = (TIntermNode **)0x0;
    ppTStack_2e0 = (TIntermNode **)0x0;
    local_2d8 = 0;
    pTVar1 = &local_2d0.destinations;
    local_2d0.super_TIntermTraverser.preVisit = true;
    local_2d0.super_TIntermTraverser.inVisit = false;
    local_2d0.super_TIntermTraverser.postVisit = false;
    local_2d0.super_TIntermTraverser.rightToLeft = false;
    local_2d0.super_TIntermTraverser.depth = 0;
    local_2d0.super_TIntermTraverser.maxDepth = 0;
    local_2d0.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_2d0.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2d0.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2d0.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d0.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node._M_size = 0;
    local_2d0.liveFunctions._M_h._M_buckets = &local_2d0.liveFunctions._M_h._M_single_bucket;
    local_2d0.liveFunctions._M_h._M_bucket_count = 1;
    local_2d0.liveFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2d0.liveFunctions._M_h._M_element_count = 0;
    local_2d0.liveFunctions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2d0.liveFunctions._M_h._M_rehash_policy._M_next_resize = 0;
    local_2d0.liveFunctions._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0.liveGlobals._M_h._M_buckets = &local_2d0.liveGlobals._M_h._M_single_bucket;
    local_2d0.liveGlobals._M_h._M_bucket_count = 1;
    local_2d0.liveGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2d0.liveGlobals._M_h._M_element_count = 0;
    local_2d0.liveGlobals._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2d0.liveGlobals._M_h._M_rehash_policy._M_next_resize = 0;
    local_2d0.liveGlobals._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2d0.traverseAll = false;
    local_2d0.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)&PTR__TLiveTraverser_00923c70;
    local_1f8 = 3;
    __s = (unit->entryPointMangledName)._M_dataplus._M_p;
    local_2d0.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pTVar1;
    local_2d0.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pTVar1;
    local_2d0.intermediate = unit;
    local_200 = &local_2f0;
    local_1f0.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_110
               ,__s,&local_1f0);
    TLiveTraverser::pushFunction(&local_2d0,&local_110);
    if (local_2d0.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1) {
      do {
        p_Var5 = local_2d0.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        p_Var2 = local_2d0.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
        local_2d0.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node._M_size =
             local_2d0.destinations.
             super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
             ._M_impl._M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var5,0x18);
        (*(code *)p_Var2->_M_next[1]._M_next)(p_Var2,&local_2d0);
      } while (local_2d0.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1);
    }
    local_310 = GetThreadPoolAllocator();
    local_308 = (undefined8 *)0x0;
    puStack_300 = (undefined8 *)0x0;
    local_2f8 = 0;
    local_330 = GetThreadPoolAllocator();
    local_328 = (TIntermNode **)0x0;
    ppTStack_320 = (TIntermNode **)0x0;
    local_318 = 0;
    local_110._M_dataplus._M_p._0_1_ = 1;
    local_110._M_dataplus._M_p._1_7_ = 0;
    local_110._M_string_length._0_4_ = 0;
    local_110.field_2._M_allocated_capacity = (size_type)GetThreadPoolAllocator();
    local_110.field_2._8_8_ = 0;
    uStack_e8 = 0;
    local_e0 = 0;
    local_c8 = 0;
    local_c0 = local_340;
    local_b8._M_buckets = &local_b8._M_single_bucket;
    local_b8._M_bucket_count = 1;
    local_b8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_b8._M_element_count = 0;
    local_b8._M_rehash_policy._M_max_load_factor = 1.0;
    local_b8._M_rehash_policy._M_next_resize = 0;
    local_b8._M_single_bucket = (__node_base_ptr)0x0;
    local_80._M_buckets = &local_80._M_single_bucket;
    local_80._M_bucket_count = 1;
    local_80._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_80._M_element_count = 0;
    local_80._M_rehash_policy._M_max_load_factor = 1.0;
    local_80._M_rehash_policy._M_next_resize = 0;
    local_80._M_single_bucket = (__node_base_ptr)0x0;
    local_48 = 1;
    local_110._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&PTR__TLiveTraverser_00923c70;
    local_40 = &local_310;
    local_38 = 4;
    local_d8 = &local_d8;
    local_d0 = &local_d8;
    (*local_340->treeRoot->_vptr_TIntermNode[2])();
    local_1e8 = 1;
    local_1e7 = 0;
    uStack_1e0 = 0;
    local_1d8 = GetThreadPoolAllocator();
    local_1d0 = 0;
    uStack_1c8 = 0;
    local_1c0 = 0;
    local_1a8 = 0;
    local_198._M_buckets = &local_198._M_single_bucket;
    local_198._M_bucket_count = 1;
    local_198._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_198._M_element_count = 0;
    local_198._M_rehash_policy._M_max_load_factor = 1.0;
    local_198._M_rehash_policy._M_next_resize = 0;
    local_198._M_single_bucket = (__node_base_ptr)0x0;
    local_338 = &local_160;
    local_160._M_buckets = &local_160._M_single_bucket;
    local_160._M_bucket_count = 1;
    local_160._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_160._M_element_count = 0;
    local_160._M_rehash_policy._M_max_load_factor = 1.0;
    local_160._M_rehash_policy._M_next_resize = 0;
    local_160._M_single_bucket = (__node_base_ptr)0x0;
    local_128 = 1;
    local_1f0.allocator = (TPoolAllocator *)&PTR__TLiveTraverser_00923c70;
    local_120 = &local_330;
    local_118 = 3;
    local_1b8 = &local_1b8;
    local_1b0 = &local_1b8;
    local_1a0 = unit;
    (*unit->treeRoot->_vptr_TIntermNode[2])();
    local_340 = (TIntermediate *)puStack_300;
    puVar13 = local_308;
    if (local_308 != puStack_300) {
      do {
        this_00 = (_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                   *)*puVar13;
        plVar10 = (long *)(**(code **)(*(long *)this_00 + 0x60))(this_00);
        pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*plVar10 + 0x1a0))(plVar10);
        iVar9 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (pbVar11,0,3,"gl_");
        if (iVar9 != 0) {
          plVar10 = (long *)(**(code **)(*(long *)this_00 + 0x60))(this_00);
          iVar9 = (**(code **)(*plVar10 + 0x100))(plVar10);
          ppTVar7 = ppTStack_2e0;
          if (iVar9 != 0x10) {
            lVar15 = (long)ppTStack_2e0 - (long)local_2e8;
            _Var12._M_current = local_2e8;
            if (0 < lVar15 >> 5) {
              lVar14 = (lVar15 >> 5) + 1;
              do {
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,_Var12);
                _Var17._M_current = _Var12._M_current;
                if (bVar8) goto LAB_003679b0;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                              )(_Var12._M_current + 1));
                _Var17._M_current = _Var12._M_current + 1;
                if (bVar8) goto LAB_003679b0;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                              )(_Var12._M_current + 2));
                _Var17._M_current = _Var12._M_current + 2;
                if (bVar8) goto LAB_003679b0;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,(__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                              )(_Var12._M_current + 3));
                _Var17._M_current = _Var12._M_current + 3;
                if (bVar8) goto LAB_003679b0;
                _Var12._M_current = _Var12._M_current + 4;
                lVar14 = lVar14 + -1;
                lVar15 = lVar15 + -0x20;
              } while (1 < lVar14);
            }
            lVar15 = lVar15 >> 3;
            if (lVar15 == 1) {
LAB_0036799c:
              bVar8 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                      ::operator()(this_00,_Var12);
              _Var17._M_current = _Var12._M_current;
              if (!bVar8) {
                _Var17._M_current = ppTVar7;
              }
LAB_003679b0:
              if (_Var17._M_current != ppTVar7) goto LAB_00367ad6;
            }
            else {
              if (lVar15 == 2) {
LAB_00367985:
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,_Var12);
                _Var17._M_current = _Var12._M_current;
                if (!bVar8) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_0036799c;
                }
                goto LAB_003679b0;
              }
              if (lVar15 == 3) {
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()(this_00,_Var12);
                _Var17._M_current = _Var12._M_current;
                if (!bVar8) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_00367985;
                }
                goto LAB_003679b0;
              }
            }
            ppTVar7 = ppTStack_320;
            lVar15 = (long)ppTStack_320 - (long)local_328;
            _Var12._M_current = local_328;
            local_348 = this_00;
            if (0 < lVar15 >> 5) {
              lVar14 = (lVar15 >> 5) + 1;
              _Var17._M_current = local_328;
              do {
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,_Var17);
                _Var12._M_current = _Var17._M_current;
                if (bVar8) goto LAB_00367ad1;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var17._M_current + 1));
                _Var12._M_current = _Var17._M_current + 1;
                if (bVar8) goto LAB_00367ad1;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var17._M_current + 2));
                _Var12._M_current = _Var17._M_current + 2;
                if (bVar8) goto LAB_00367ad1;
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var17._M_current + 3));
                _Var12._M_current = _Var17._M_current + 3;
                if (bVar8) goto LAB_00367ad1;
                _Var12._M_current = _Var17._M_current + 4;
                lVar14 = lVar14 + -1;
                lVar15 = lVar15 + -0x20;
                _Var17._M_current = _Var12._M_current;
              } while (1 < lVar14);
            }
            lVar15 = lVar15 >> 3;
            if (lVar15 == 1) {
LAB_00367abd:
              bVar8 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                    *)&local_348,_Var12);
              if (!bVar8) {
                _Var12._M_current = ppTVar7;
              }
LAB_00367ad1:
              if (_Var12._M_current != ppTVar7) goto LAB_00367ad6;
            }
            else {
              if (lVar15 == 2) {
LAB_00367aa5:
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,_Var12);
                if (!bVar8) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_00367abd;
                }
                goto LAB_00367ad1;
              }
              if (lVar15 == 3) {
                bVar8 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_348,_Var12);
                if (!bVar8) {
                  _Var12._M_current = _Var12._M_current + 1;
                  goto LAB_00367aa5;
                }
                goto LAB_00367ad1;
              }
            }
            plVar10 = (long *)(**(code **)(*(long *)this_00 + 0x60))(this_00);
            lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
            *(ulong *)(lVar15 + 8) = (*(ulong *)(lVar15 + 8) & 0xffffffffffffff80) + 1;
            lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
            *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) & 0xffffc01f1fffffff;
            lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
            ppTVar7 = ppTStack_320;
            *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) & 0x1fffffffffffffff;
            *(byte *)(lVar15 + 0x10) = *(byte *)(lVar15 + 0x10) & 0xf0;
            *(undefined8 *)(lVar15 + 0x14) = 0xffffffffffffffff;
            *(undefined4 *)(lVar15 + 0x2d) = 0;
            *(undefined8 *)(lVar15 + 0x34) = 0xfffff800;
            *(undefined2 *)(lVar15 + 0x48) = 0;
            *(undefined1 *)(lVar15 + 0x2c) = 0;
            *(ulong *)(lVar15 + 0x1c) =
                 (ulong)((uint)*(undefined8 *)(lVar15 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff;
            *(ulong *)(lVar15 + 0x24) = *(ulong *)(lVar15 + 0x24) | 0x1ffffff7fffffff;
            for (ppTVar16 = local_328; ppTVar16 != ppTVar7; ppTVar16 = ppTVar16 + 1) {
              pTVar3 = *ppTVar16;
              plVar10 = (long *)(**(code **)(*(long *)this_00 + 0x60))(this_00);
              pbVar11 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*plVar10 + 0x1a0))(plVar10);
              iVar9 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
              __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x1a0))
                                ((long *)CONCAT44(extraout_var,iVar9));
              iVar9 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(pbVar11,__str);
              if (iVar9 == 0) {
                iVar9 = (*pTVar3->_vptr_TIntermNode[0xc])(pTVar3);
                plVar10 = (long *)CONCAT44(extraout_var_00,iVar9);
                lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
                *(ulong *)(lVar15 + 8) = (*(ulong *)(lVar15 + 8) & 0xffffffffffffff80) + 1;
                lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
                *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) & 0xffffc01f1fffffff;
                lVar15 = (**(code **)(*plVar10 + 0x108))(plVar10);
                *(ulong *)(lVar15 + 8) = *(ulong *)(lVar15 + 8) & 0x1fffffffffffffff;
                *(byte *)(lVar15 + 0x10) = *(byte *)(lVar15 + 0x10) & 0xf0;
                *(undefined8 *)(lVar15 + 0x14) = 0xffffffffffffffff;
                *(undefined4 *)(lVar15 + 0x2d) = 0;
                *(undefined8 *)(lVar15 + 0x34) = 0xfffff800;
                *(undefined2 *)(lVar15 + 0x48) = 0;
                *(undefined1 *)(lVar15 + 0x2c) = 0;
                *(ulong *)(lVar15 + 0x1c) =
                     (ulong)((uint)*(undefined8 *)(lVar15 + 0x1c) & 0xffc00000) | 0xffffffff001fcfff
                ;
                *(ulong *)(lVar15 + 0x24) = *(ulong *)(lVar15 + 0x24) | 0x1ffffff7fffffff;
              }
            }
          }
        }
LAB_00367ad6:
        puVar13 = puVar13 + 1;
      } while ((TIntermediate *)puVar13 != local_340);
    }
    local_1f0.allocator = (TPoolAllocator *)&PTR__TLiveTraverser_00923dc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(local_338);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_198);
    pppppppuVar6 = (undefined8 *******)local_1b8;
    while (pppppppuVar6 != &local_1b8) {
      pppppppuVar4 = (undefined8 *******)*pppppppuVar6;
      operator_delete(pppppppuVar6,0x18);
      pppppppuVar6 = pppppppuVar4;
    }
    local_110._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&PTR__TLiveTraverser_00923dc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_80);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_b8);
    pppppppuVar6 = (undefined8 *******)local_d8;
    while (pppppppuVar6 != &local_d8) {
      pppppppuVar4 = (undefined8 *******)*pppppppuVar6;
      operator_delete(pppppppuVar6,0x18);
      pppppppuVar6 = pppppppuVar4;
    }
    local_2d0.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)&PTR__TLiveTraverser_00923dc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_2d0.liveGlobals._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_2d0.liveFunctions._M_h);
    p_Var2 = local_2d0.destinations.
             super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&local_2d0.destinations) {
      p_Var5 = (((_List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var2,0x18);
      p_Var2 = p_Var5;
    }
  }
  return;
}

Assistant:

void TIntermediate::optimizeStageIO(TInfoSink&, TIntermediate& unit)
{
    // don't do any input/output demotion on compute, raytracing, or task/mesh stages
    // TODO: support task/mesh
    if (getStage() > EShLangFragment || unit.getStage() > EShLangFragment) {
        return;
    }

    class TIOTraverser : public TLiveTraverser {
    public:
        TIOTraverser(TIntermediate& i, bool all, TIntermSequence& sequence, TStorageQualifier storage)
            : TLiveTraverser(i, all, true, false, false), sequence(sequence), storage(storage)
        {
        }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (symbol->getQualifier().storage == storage) {
                sequence.push_back(symbol);
            }
        }

    private:
        TIntermSequence& sequence;
        TStorageQualifier storage;
    };

    // live symbols only
    TIntermSequence unitLiveInputs;

    TIOTraverser unitTraverser(unit, false, unitLiveInputs, EvqVaryingIn);
    unitTraverser.pushFunction(unit.getEntryPointMangledName().c_str());
    while (! unitTraverser.destinations.empty()) {
        TIntermNode* destination = unitTraverser.destinations.back();
        unitTraverser.destinations.pop_back();
        destination->traverse(&unitTraverser);
    }

    TIntermSequence allOutputs;
    TIntermSequence unitAllInputs;

    TIOTraverser allTraverser(*this, true, allOutputs, EvqVaryingOut);
    getTreeRoot()->traverse(&allTraverser);

    TIOTraverser unitAllTraverser(unit, true, unitAllInputs, EvqVaryingIn);
    unit.getTreeRoot()->traverse(&unitAllTraverser);

    // find outputs not consumed by the next stage
    std::for_each(allOutputs.begin(), allOutputs.end(), [&unitLiveInputs, &unitAllInputs](TIntermNode* output) {
        // don't do anything to builtins
        if (output->getAsSymbolNode()->getAccessName().compare(0, 3, "gl_") == 0)
            return;

        // don't demote block outputs (for now)
        if (output->getAsSymbolNode()->getBasicType() == EbtBlock)
            return;

        // check if the (loose) output has a matching loose input
        auto isMatchingInput = [output](TIntermNode* input) {
            return output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName();
        };

        // check if the (loose) output has a matching block member input
        auto isMatchingInputBlockMember = [output](TIntermNode* input) {
            // ignore loose inputs
            if (input->getAsSymbolNode()->getBasicType() != EbtBlock)
                return false;

            // don't demote loose outputs with matching input block members
            auto isMatchingBlockMember = [output](TTypeLoc type) {
                return type.type->getFieldName() == output->getAsSymbolNode()->getName();
            };
            const TTypeList* members = input->getAsSymbolNode()->getType().getStruct();
            return std::any_of(members->begin(), members->end(), isMatchingBlockMember);
        };

        // determine if the input/output pair should be demoted
        // do the faster (and more likely) loose-loose check first
        if (std::none_of(unitLiveInputs.begin(), unitLiveInputs.end(), isMatchingInput) && 
            std::none_of(unitAllInputs.begin(), unitAllInputs.end(), isMatchingInputBlockMember)) {
            // demote any input matching the output
            auto demoteMatchingInputs = [output](TIntermNode* input) {
                if (output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName()) {
                    // demote input to a plain variable
                    TIntermSymbol* symbol = input->getAsSymbolNode();
                    symbol->getQualifier().storage = EvqGlobal;
                    symbol->getQualifier().clearInterstage();
                    symbol->getQualifier().clearLayout();
                }
            };

            // demote all matching outputs to a plain variable
            TIntermSymbol* symbol = output->getAsSymbolNode();
            symbol->getQualifier().storage = EvqGlobal;
            symbol->getQualifier().clearInterstage();
            symbol->getQualifier().clearLayout();
            std::for_each(unitAllInputs.begin(), unitAllInputs.end(), demoteMatchingInputs);
        }
    });
}